

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O0

bool __thiscall VersionsList::VersionLess(VersionsList *this,string *a,string *b)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int res;
  string *b_local;
  string *a_local;
  VersionsList *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  iVar1 = version_compare4(uVar2,uVar3,this->flags_,this->flags_);
  if (iVar1 < 0) {
    this_local._7_1_ = true;
  }
  else if (iVar1 < 1) {
    this_local._7_1_ = std::operator<(a,b);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VersionLess(const std::string& a, const std::string& b) const {
		int res = version_compare4(a.c_str(), b.c_str(), flags_, flags_);
		if (res < 0) {
			return true;
		}
		if (res > 0) {
			return false;
		}

		return a < b;  // fallback to stringwise comparison for stable ordering
	}